

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RESTORE_MANA(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  ushort uVar2;
  player *ppVar3;
  wchar_t wVar4;
  short sVar5;
  wchar_t wVar6;
  char *fmt;
  
  wVar4 = effect_calculate_value(context,false);
  ppVar3 = player;
  uVar2 = player->msp;
  if (player->csp < (short)uVar2) {
    wVar6 = (uint)uVar2;
    if (wVar4 != L'\0') {
      wVar6 = wVar4;
    }
    sVar5 = player->csp + (short)wVar6;
    player->csp = sVar5;
    if ((short)uVar2 < sVar5) {
      ppVar3->csp = uVar2;
      ppVar3->csp_frac = 0;
      fmt = "You feel your head clear.";
    }
    else {
      fmt = "You feel your head clear somewhat.";
    }
    msg(fmt);
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x80;
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_RESTORE_MANA(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	if (!amount) amount = player->msp;
	if (player->csp < player->msp) {
		player->csp += amount;
		if (player->csp > player->msp) {
			player->csp = player->msp;
			player->csp_frac = 0;
			msg("You feel your head clear.");
		} else
			msg("You feel your head clear somewhat.");
		player->upkeep->redraw |= (PR_MANA);
	}
	context->ident = true;

	return true;
}